

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind.cc
# Opt level: O0

bool absl::lts_20250127::str_format_internal::FormatUntyped
               (FormatRawSinkImpl raw_sink,UntypedFormatSpecImpl format,
               Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl> args)

{
  Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl> args_00;
  UntypedFormatSpecImpl format_00;
  bool bVar1;
  DefaultConverter local_490;
  pointer local_488;
  size_type sStack_480;
  void *local_478;
  size_t sStack_470;
  void *local_468;
  _func_void_void_ptr_string_view *p_Stack_460;
  undefined1 local_458 [8];
  FormatSinkImpl sink;
  Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl> args_local;
  UntypedFormatSpecImpl format_local;
  FormatRawSinkImpl raw_sink_local;
  
  sink.buf_._1016_8_ = args.ptr_;
  p_Stack_460 = raw_sink.write_;
  local_468 = raw_sink.sink_;
  FormatSinkImpl::FormatSinkImpl((FormatSinkImpl *)local_458,raw_sink);
  local_488 = (pointer)sink.buf_._1016_8_;
  sStack_480 = args.len_;
  local_478 = format.data_;
  sStack_470 = format.size_;
  anon_unknown_3::DefaultConverter::DefaultConverter(&local_490,(FormatSinkImpl *)local_458);
  format_00.size_ = sStack_470;
  format_00.data_ = local_478;
  args_00.len_ = sStack_480;
  args_00.ptr_ = local_488;
  bVar1 = anon_unknown_3::
          ConvertAll<absl::lts_20250127::str_format_internal::(anonymous_namespace)::DefaultConverter>
                    (format_00,args_00,local_490);
  FormatSinkImpl::~FormatSinkImpl((FormatSinkImpl *)local_458);
  return bVar1;
}

Assistant:

bool FormatUntyped(FormatRawSinkImpl raw_sink,
                   const UntypedFormatSpecImpl format,
                   absl::Span<const FormatArgImpl> args) {
  FormatSinkImpl sink(raw_sink);
  using Converter = DefaultConverter;
  return ConvertAll(format, args, Converter(&sink));
}